

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-stats.cc
# Opt level: O3

bool wabt::operator<(OpcodeInfo *lhs,OpcodeInfo *rhs)

{
  Enum EVar1;
  Enum EVar2;
  bool bVar3;
  
  EVar1 = (lhs->opcode_).enum_;
  EVar2 = (rhs->opcode_).enum_;
  bVar3 = true;
  if (EVar2 <= EVar1) {
    if (EVar1 <= EVar2) {
      if ((int)lhs->kind_ < (int)rhs->kind_) {
        return true;
      }
      if ((int)lhs->kind_ <= (int)rhs->kind_) {
        bVar3 = std::__lexicographical_compare<true>::__lc<unsigned_char,unsigned_char>
                          ((lhs->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           (lhs->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish,
                           (rhs->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           (rhs->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
        if (bVar3) {
          return true;
        }
        std::__lexicographical_compare<true>::__lc<unsigned_char,unsigned_char>
                  ((rhs->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (rhs->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   (lhs->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (lhs->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

std::pair<const T*, size_t> OpcodeInfo::GetDataArray() const {
  if (data_.empty()) {
    return std::pair<const T*, size_t>(nullptr, 0);
  }

  assert(data_.size() % sizeof(T) == 0);
  return std::make_pair(reinterpret_cast<const T*>(data_.data()),
                        data_.size() / sizeof(T));
}